

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::audit_feature(audit_results *dat,float ft_weight,uint64_t ft_idx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  uint32_t uVar3;
  vw *pvVar4;
  pointer pbVar5;
  shared_data *psVar6;
  uint64_t *puVar7;
  ostream *poVar8;
  float *pfVar9;
  weight *pwVar10;
  long *plVar11;
  const_iterator cVar12;
  size_type *psVar13;
  ulong i;
  uint32_t *puVar14;
  string *s;
  pointer pbVar15;
  float fVar16;
  float fVar17;
  string_value sv;
  string ns_pre;
  ostringstream tempstream;
  value_type local_210;
  key_type local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [32];
  ulong local_188;
  ios_base local_138 [264];
  
  pvVar4 = dat->all;
  puVar14 = &(pvVar4->weights).dense_weights._stride_shift;
  puVar7 = &(pvVar4->weights).dense_weights._weight_mask;
  if ((pvVar4->weights).sparse != false) {
    puVar14 = &(pvVar4->weights).sparse_weights._stride_shift;
    puVar7 = &(pvVar4->weights).sparse_weights._weight_mask;
  }
  i = ft_idx & *puVar7;
  uVar3 = *puVar14;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  pbVar15 = (dat->ns_pre).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (dat->ns_pre).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar15 != pbVar5) {
    do {
      std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)(pbVar15->_M_dataplus)._M_p);
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 != pbVar5);
  }
  if (dat->all->audit != false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_210.v._0_1_ = 0x3a;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_210,1);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    local_210.v._0_1_ = 0x3a;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_210,1);
    poVar8 = std::ostream::_M_insert<double>((double)ft_weight);
    local_210.v = (float)CONCAT31(local_210.v._1_3_,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_210,1);
    if ((pvVar4->weights).sparse == true) {
      pfVar9 = sparse_parameters::operator[](&(pvVar4->weights).sparse_weights,i);
    }
    else {
      pfVar9 = (pvVar4->weights).dense_weights._begin +
               ((pvVar4->weights).dense_weights._weight_mask & i);
    }
    fVar2 = *pfVar9;
    psVar6 = dat->all->sd;
    fVar16 = (float)psVar6->gravity;
    fVar17 = 0.0;
    if (fVar16 < ABS(fVar2)) {
      fVar17 = fVar16 * *(float *)(&DAT_00280dc0 + (ulong)(fVar2 < 0.0) * 4) + fVar2;
    }
    std::ostream::_M_insert<double>((double)((float)psVar6->contraction * fVar17));
    if (dat->all->adaptive == true) {
      local_210.v = (float)CONCAT31(local_210.v._1_3_,0x40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_210,1);
      if ((pvVar4->weights).sparse == true) {
        pwVar10 = sparse_parameters::operator[](&(pvVar4->weights).sparse_weights,i);
      }
      else {
        pwVar10 = (pvVar4->weights).dense_weights._begin +
                  ((pvVar4->weights).dense_weights._weight_mask & i);
      }
      std::ostream::_M_insert<double>((double)pwVar10[1]);
    }
    if ((pvVar4->weights).sparse == true) {
      pfVar9 = sparse_parameters::operator[](&(pvVar4->weights).sparse_weights,i);
    }
    else {
      pfVar9 = (pvVar4->weights).dense_weights._begin +
               ((pvVar4->weights).dense_weights._weight_mask & i);
    }
    local_210.v = ft_weight * *pfVar9;
    std::__cxx11::stringbuf::str();
    plVar11 = (long *)std::__cxx11::string::replace
                                ((ulong)local_1c8,0,(char *)0x0,(ulong)local_1e8._M_dataplus._M_p);
    paVar1 = &local_210.s.field_2;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_210.s.field_2._M_allocated_capacity = *psVar13;
      local_210.s.field_2._8_8_ = plVar11[3];
      local_210.s._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_210.s.field_2._M_allocated_capacity = *psVar13;
      local_210.s._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_210.s._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    std::vector<GD::string_value,_std::allocator<GD::string_value>_>::push_back
              (&dat->results,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.s._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.s._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pvVar4 = dat->all;
  if (((pvVar4->current_pass == 0) || (pvVar4->training == false)) && (pvVar4->hash_inv == true)) {
    if (dat->offset != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      local_210.v._0_1_ = 0x5b;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)&local_210,1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      local_210.v = (float)CONCAT31(local_210.v._1_3_,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_210,1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_1e8,CONCAT44(local_210._4_4_,local_210.v));
      if ((size_type *)CONCAT44(local_210._4_4_,local_210.v) != &local_210.s._M_string_length) {
        operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210.v));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    pvVar4 = dat->all;
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::find(&(pvVar4->name_index_map)._M_t,&local_1e8);
    if ((_Rb_tree_header *)cVar12._M_node ==
        &(pvVar4->name_index_map)._M_t._M_impl.super__Rb_tree_header) {
      pvVar4 = dat->all;
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_1e8._M_dataplus._M_p,
                 local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
      local_188 = i >> ((byte)uVar3 & 0x3f);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_long>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)&pvVar4->name_index_map,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                  *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void audit_feature(audit_results& dat, const float ft_weight, const uint64_t ft_idx)
{
  parameters& weights = dat.all.weights;
  uint64_t index = ft_idx & weights.mask();
  size_t stride_shift = weights.stride_shift();

  string ns_pre;
  for (string& s : dat.ns_pre) ns_pre += s;

  if (dat.all.audit)
  {
    ostringstream tempstream;
    tempstream << ':' << (index >> stride_shift) << ':' << ft_weight << ':'
               << trunc_weight(weights[index], (float)dat.all.sd->gravity) * (float)dat.all.sd->contraction;

    if (dat.all.adaptive)
      tempstream << '@' << (&weights[index])[1];

    string_value sv = {weights[index] * ft_weight, ns_pre + tempstream.str()};
    dat.results.push_back(sv);
  }

  if ((dat.all.current_pass == 0 || dat.all.training == false) && dat.all.hash_inv)
  {
    // for invert_hash

    if (dat.offset != 0)
    {
      // otherwise --oaa output no features for class > 0.
      ostringstream tempstream;
      tempstream << '[' << (dat.offset >> stride_shift) << ']';
      ns_pre += tempstream.str();
    }

    if (!dat.all.name_index_map.count(ns_pre))
      dat.all.name_index_map.insert(std::map<std::string, size_t>::value_type(ns_pre, index >> stride_shift));
  }
}